

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libwebsockets.c
# Opt level: O0

int lws_strexp_expand(lws_strexp_t *exp,char *in,size_t len,size_t *pused_in,size_t *pused_out)

{
  char cVar1;
  byte bVar2;
  size_t sVar3;
  int iVar4;
  ulong uStack_40;
  int n;
  size_t used;
  size_t *pused_out_local;
  size_t *pused_in_local;
  size_t len_local;
  char *in_local;
  lws_strexp_t *exp_local;
  
  uStack_40 = 0;
  len_local = (size_t)in;
  do {
    if (len <= uStack_40) {
      exp->out[exp->pos] = '\0';
      *pused_in = uStack_40;
      *pused_out = exp->pos;
      return 0;
    }
    switch(exp->state) {
    case '\0':
      if (*(char *)len_local == '$') {
        exp->state = '\x01';
      }
      else {
        cVar1 = *(char *)len_local;
        sVar3 = exp->pos;
        exp->pos = sVar3 + 1;
        exp->out[sVar3] = cVar1;
        if (exp->olen == exp->pos) {
          *pused_in = uStack_40 + 1;
          *pused_out = exp->pos;
          return 1;
        }
      }
      break;
    case '\x01':
      if (*(char *)len_local == '{') {
        exp->state = '\x02';
        exp->name_pos = '\0';
      }
      else {
        if (exp->olen - exp->pos < 3) {
          return -1;
        }
        sVar3 = exp->pos;
        exp->pos = sVar3 + 1;
        exp->out[sVar3] = '$';
        cVar1 = *(char *)len_local;
        sVar3 = exp->pos;
        exp->pos = sVar3 + 1;
        exp->out[sVar3] = cVar1;
        if (*(char *)len_local != '$') {
          exp->state = '\0';
        }
      }
      break;
    case '\x02':
      if (*(char *)len_local == '}') {
        exp->name[exp->name_pos] = '\0';
        exp->state = '\x03';
        goto LAB_00111bc4;
      }
      if (0x1e < exp->name_pos) {
        return -1;
      }
      cVar1 = *(char *)len_local;
      bVar2 = exp->name_pos;
      exp->name_pos = bVar2 + 1;
      exp->name[bVar2] = cVar1;
      break;
    case '\x03':
LAB_00111bc4:
      *pused_in = uStack_40;
      iVar4 = (*exp->cb)(exp->priv,exp->name,exp->out,&exp->pos,exp->olen,&exp->exp_ofs);
      *pused_out = exp->pos;
      if (iVar4 == 1) {
        return 1;
      }
      if (iVar4 == -2) {
        return -2;
      }
      exp->state = '\0';
    }
    uStack_40 = uStack_40 + 1;
    len_local = len_local + 1;
  } while( true );
}

Assistant:

int
lws_strexp_expand(lws_strexp_t *exp, const char *in, size_t len,
		  size_t *pused_in, size_t *pused_out)
{
	size_t used = 0;
	int n;

	while (used < len) {

		switch (exp->state) {
		case LWS_EXPS_LITERAL:
			if (*in == '$') {
				exp->state = LWS_EXPS_OPEN_OR_LIT;
				break;
			}

			exp->out[exp->pos++] = *in;
			if (exp->olen - exp->pos < 1) {
				*pused_in = used + 1;
				*pused_out = exp->pos;
				return LSTRX_FILLED_OUT;
			}
			break;

		case LWS_EXPS_OPEN_OR_LIT:
			if (*in == '{') {
				exp->state = LWS_EXPS_NAME_OR_CLOSE;
				exp->name_pos = 0;
				break;
			}
			/* treat as a literal */
			if (exp->olen - exp->pos < 3)
				return -1;

			exp->out[exp->pos++] = '$';
			exp->out[exp->pos++] = *in;
			if (*in != '$')
				exp->state = LWS_EXPS_LITERAL;
			break;

		case LWS_EXPS_NAME_OR_CLOSE:
			if (*in == '}') {
				exp->name[exp->name_pos] = '\0';
				exp->state = LWS_EXPS_DRAIN;
				goto drain;
			}
			if (exp->name_pos >= sizeof(exp->name) - 1)
				return LSTRX_FATAL_NAME_TOO_LONG;

			exp->name[exp->name_pos++] = *in;
			break;

		case LWS_EXPS_DRAIN:
drain:
			*pused_in = used;
			n = exp->cb(exp->priv, exp->name, exp->out, &exp->pos,
				    exp->olen, &exp->exp_ofs);
			*pused_out = exp->pos;
			if (n == LSTRX_FILLED_OUT ||
			    n == LSTRX_FATAL_NAME_UNKNOWN)
				return n;

			exp->state = LWS_EXPS_LITERAL;
			break;
		}

		used++;
		in++;
	}

	exp->out[exp->pos] = '\0';
	*pused_in = used;
	*pused_out = exp->pos;

	return LSTRX_DONE;
}